

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_force(char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  char cVar3;
  uint uVar4;
  BYTE *s;
  long *plVar5;
  ulong uVar6;
  short *psVar7;
  char *pcVar8;
  int *piVar9;
  long *plVar10;
  ulong *puVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  BYTE *d;
  short *psVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long *plVar21;
  long *plVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  char cVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  BYTE *e;
  ulong uVar30;
  char *pcVar31;
  BYTE *d_1;
  int *piVar32;
  long lVar33;
  int *piVar34;
  char *pcVar35;
  bool bVar36;
  LZ4_stream_t ctx;
  long *local_40c8;
  int local_4090;
  uint local_4050 [4096];
  uint local_50;
  undefined2 local_4a;
  int local_38;
  
  memset(local_4050,0,0x4020);
  lVar29 = (long)src - (ulong)local_50;
  pcVar27 = dst + dstCapacity;
  local_4090 = (int)dst;
  if (srcSize < 0x1000b) {
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    local_38 = local_38 + srcSize;
    local_4a = 3;
    piVar9 = (int *)src;
    uVar15 = local_50 + srcSize;
    if (0xc < srcSize) {
      *(short *)((long)local_4050 + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
           (short)local_50;
      piVar34 = (int *)(src + 1);
      uVar18 = (ulong)((uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13);
      psVar17 = (short *)dst;
      pcVar31 = src;
      local_50 = local_50 + srcSize;
      do {
        iVar19 = 1;
        piVar32 = piVar34;
        iVar20 = acceleration << 6;
        do {
          piVar34 = piVar32;
          piVar32 = (int *)((long)iVar19 + (long)piVar34);
          sVar2 = (short)lVar29;
          if (src + (long)srcSize + -0xb < piVar32) {
            iVar13 = 2;
          }
          else {
            uVar30 = (ulong)*(ushort *)((long)local_4050 + uVar18 * 2);
            iVar19 = *piVar32;
            *(short *)((long)local_4050 + uVar18 * 2) = (short)piVar34 - sVar2;
            iVar13 = 7;
            if (*(int *)(lVar29 + uVar30) != *piVar34) {
              iVar13 = 0;
            }
            pcVar31 = (char *)(uVar30 + lVar29);
            uVar18 = (ulong)((uint)(iVar19 * -0x61c8864f) >> 0x13);
          }
          iVar19 = iVar20 >> 6;
          iVar20 = iVar20 + 1;
        } while (iVar13 == 0);
        if (iVar13 == 7) {
          iVar13 = 0;
        }
        dst = (char *)psVar17;
        if (iVar13 == 0) {
          uVar14 = (int)piVar34 - (int)piVar9;
          lVar33 = 0;
          cVar3 = (char)piVar34 * '\x10' + (char)piVar9 * -0x10;
          uVar15 = uVar14 - 0xf;
          do {
            uVar4 = uVar15;
            cVar26 = cVar3;
            lVar28 = lVar33;
            pcVar35 = pcVar31 + lVar28;
            piVar32 = (int *)((long)piVar34 + lVar28);
            if ((pcVar35 <= src) || (piVar32 <= piVar9)) break;
            lVar33 = lVar28 + -1;
            cVar3 = cVar26 + -0x10;
            uVar15 = uVar4 - 1;
          } while (*(char *)((long)piVar34 + lVar28 + -1) == pcVar31[lVar28 + -1]);
          iVar20 = (int)lVar28;
          uVar30 = (ulong)(uint)(iVar20 + ((int)piVar34 - (int)piVar9));
          dst = (char *)((long)psVar17 + 1);
          pcVar8 = (char *)((long)psVar17 +
                           ((ulong)uVar14 + lVar28 & 0xffffffff) / 0xff + uVar30 + 9);
          if (pcVar27 < pcVar8) {
            iVar13 = 1;
          }
          else {
            if ((uint)((ulong)uVar14 + lVar28) < 0xf) {
              *(char *)psVar17 = cVar26;
              psVar7 = (short *)dst;
            }
            else {
              uVar6 = (ulong)(uVar14 - 0xf) + lVar28;
              *(char *)psVar17 = -0x10;
              if (0xfe < (int)uVar6) {
                if (0x1fc < (int)uVar4) {
                  uVar4 = 0x1fd;
                }
                uVar15 = (uVar14 - uVar4) + iVar20 + 0xef;
                uVar6 = (ulong)uVar15 / 0xff;
                memset(dst,0xff,(ulong)(uVar15 / 0xff + 1));
                dst = (char *)((long)psVar17 + uVar6 + 2);
                uVar6 = (ulong)((uVar14 - 0x10e) + iVar20 + (int)uVar6 * -0xff);
              }
              *dst = (char)uVar6;
              psVar7 = (short *)((long)dst + 1);
            }
            dst = (char *)(uVar30 + (long)psVar7);
            piVar34 = piVar9;
            do {
              *(undefined8 *)psVar7 = *(undefined8 *)piVar34;
              psVar7 = psVar7 + 4;
              piVar34 = piVar34 + 2;
            } while (psVar7 < dst);
            iVar13 = 0;
          }
          pcVar31 = pcVar35;
          piVar34 = piVar32;
          if (pcVar8 <= pcVar27) {
            do {
              *(short *)dst = (short)piVar34 - (short)pcVar35;
              puVar1 = (ulong *)(piVar34 + 1);
              puVar16 = (ulong *)(pcVar35 + 4);
              puVar11 = puVar1;
              piVar32 = piVar9;
              if (puVar1 < src + (long)srcSize + -0xc) {
                uVar6 = *(ulong *)(piVar34 + 1) ^ *(ulong *)(pcVar35 + 4);
                uVar30 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                piVar32 = (int *)(uVar30 >> 3 & 0x1fffffff);
                uVar15 = (uint)piVar32;
                puVar11 = (ulong *)(piVar34 + 3);
                puVar16 = (ulong *)(pcVar35 + 0xc);
                if (*(ulong *)(pcVar35 + 4) == *(ulong *)(piVar34 + 1)) goto LAB_00111275;
              }
              else {
LAB_00111275:
                do {
                  if (src + (long)srcSize + -0xc <= puVar11) {
                    if ((puVar11 < src + (long)srcSize + -8) && ((int)*puVar16 == (int)*puVar11)) {
                      puVar11 = (ulong *)((long)puVar11 + 4);
                      puVar16 = (ulong *)((long)puVar16 + 4);
                    }
                    if ((puVar11 < src + (long)srcSize + -6) && ((short)*puVar16 == (short)*puVar11)
                       ) {
                      puVar11 = (ulong *)((long)puVar11 + 2);
                      puVar16 = (ulong *)((long)puVar16 + 2);
                    }
                    if (puVar11 < src + (long)srcSize + -5) {
                      puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar16 == (char)*puVar11))
                      ;
                    }
                    uVar15 = (int)puVar11 - (int)puVar1;
                    break;
                  }
                  uVar30 = *puVar16;
                  uVar24 = *puVar11 ^ uVar30;
                  uVar6 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  puVar25 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar11);
                  puVar16 = puVar16 + 1;
                  bVar36 = uVar30 == *puVar11;
                  puVar11 = puVar11 + 1;
                  if (!bVar36) {
                    puVar11 = puVar25;
                  }
                  piVar32 = (int *)((ulong)piVar32 & 0xffffffff);
                  if (!bVar36) {
                    piVar32 = (int *)(ulong)(uint)((int)puVar25 - (int)puVar1);
                  }
                  uVar15 = (uint)piVar32;
                } while (bVar36);
              }
              psVar7 = (short *)((long)dst + 2);
              pcVar8 = (char *)((long)dst + (ulong)(uVar15 + 0xf0) / 0xff + 8);
              if (pcVar8 <= pcVar27) {
                if (uVar15 < 0xf) {
                  *(char *)psVar17 = (char)*psVar17 + (char)uVar15;
                }
                else {
                  *(char *)psVar17 = (char)*psVar17 + '\x0f';
                  uVar14 = uVar15 - 0xf;
                  psVar7[0] = -1;
                  psVar7[1] = -1;
                  if (0x3fb < uVar14) {
                    uVar4 = uVar15 - 0x40b;
                    memset((short *)((long)dst + 6),0xff,(ulong)((uVar4 / 0x3fc) * 4 + 4));
                    uVar14 = uVar4 % 0x3fc;
                    psVar7 = (short *)((long)dst + (ulong)((uVar4 / 0x3fc) * 4) + 6);
                  }
                  pcVar31 = (char *)((long)psVar7 + (ulong)uVar14 / 0xff);
                  psVar7 = (short *)(pcVar31 + 1);
                  *pcVar31 = (char)(uVar14 / 0xff) + (char)uVar14;
                }
              }
              lVar33 = (long)piVar34 + (ulong)uVar15;
              piVar34 = (int *)(lVar33 + 4);
              dst = (char *)psVar7;
              pcVar31 = pcVar35;
              if (pcVar27 < pcVar8) {
                iVar13 = 1;
                goto LAB_001114ad;
              }
              piVar9 = piVar34;
              if (src + (long)srcSize + -0xb <= piVar34) {
                iVar13 = 3;
                goto LAB_001114ad;
              }
              *(short *)((long)local_4050 +
                        (ulong)((uint)(*(int *)(lVar33 + 2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)lVar33 + 2) - sVar2;
              uVar30 = (ulong)((uint)(*piVar34 * -0x61c8864f) >> 0x13);
              uVar6 = (ulong)*(ushort *)((long)local_4050 + uVar30 * 2);
              *(short *)((long)local_4050 + uVar30 * 2) = (short)piVar34 - sVar2;
              iVar20 = *(int *)(lVar29 + uVar6);
              iVar19 = *piVar34;
              if (iVar20 == iVar19) {
                *(char *)psVar7 = '\0';
                dst = (char *)((long)psVar7 + 1);
                psVar17 = psVar7;
              }
              pcVar35 = (char *)(uVar6 + lVar29);
            } while (iVar20 == iVar19);
            uVar18 = (ulong)((uint)(*(int *)(lVar33 + 5) * -0x61c8864f) >> 0x13);
            iVar13 = 0;
            pcVar31 = pcVar35;
            piVar34 = (int *)(lVar33 + 5);
          }
        }
LAB_001114ad:
        psVar17 = (short *)dst;
      } while (iVar13 == 0);
      uVar15 = local_50;
      if (1 < iVar13 - 2U) goto LAB_00111577;
    }
    local_50 = uVar15;
    iVar20 = 0;
    pcVar31 = src + ((long)srcSize - (long)piVar9);
    pcVar35 = (char *)((long)dst + (long)(pcVar31 + (ulong)(pcVar31 + 0xf0) / 0xff + 1));
    if (pcVar35 <= pcVar27) {
      if (pcVar31 < (char *)0xf) {
        *dst = (char)pcVar31 << 4;
      }
      else {
        pcVar8 = pcVar31 + -0xf;
        *dst = -0x10;
        psVar17 = (short *)((long)dst + 1);
        if ((char *)0xfe < pcVar8) {
          uVar18 = (ulong)(pcVar31 + -0x10e) / 0xff;
          memset((short *)((long)dst + 1),0xff,uVar18 + 1);
          pcVar8 = pcVar31 + uVar18 * -0xff + -0x10e;
          psVar17 = (short *)((long)dst + uVar18 + 2);
        }
        dst = (char *)psVar17;
        *dst = (char)pcVar8;
      }
      memcpy((char *)((long)dst + 1),piVar9,(size_t)pcVar31);
      dst = (char *)((long)dst + (long)(pcVar31 + 1));
    }
    if (pcVar35 <= pcVar27) {
      iVar20 = (int)dst - local_4090;
    }
  }
  else {
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    local_38 = local_38 + srcSize;
    local_4a = 2;
    local_4050[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = local_50;
    plVar22 = (long *)(src + 1);
    uVar18 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    piVar9 = (int *)src;
    local_40c8 = (long *)src;
    local_50 = srcSize + local_50;
    do {
      iVar19 = 1;
      iVar20 = acceleration << 6;
      while( true ) {
        plVar21 = (long *)((long)iVar19 + (long)plVar22);
        iVar19 = (int)plVar22;
        iVar13 = (int)lVar29;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar21) {
          iVar12 = 2;
        }
        else {
          uVar15 = local_4050[uVar18];
          piVar9 = (int *)((ulong)uVar15 + lVar29);
          uVar30 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
          local_4050[uVar18] = iVar19 - iVar13;
          iVar12 = 8;
          uVar18 = uVar30;
          if (((uint)(iVar19 - iVar13) <= uVar15 + 0xffff) && (iVar12 = 7, *piVar9 != (int)*plVar22)
             ) {
            iVar12 = 0;
          }
        }
        if ((iVar12 != 0) && (iVar12 != 8)) break;
        iVar19 = iVar20 >> 6;
        iVar20 = iVar20 + 1;
        plVar22 = plVar21;
      }
      if (iVar12 == 7) {
        iVar12 = 0;
      }
      plVar21 = (long *)dst;
      if (iVar12 == 0) {
        uVar14 = iVar19 - (int)local_40c8;
        lVar33 = 0;
        cVar3 = (char)plVar22 * '\x10' + (char)local_40c8 * -0x10;
        uVar15 = uVar14 - 0xf;
        do {
          uVar4 = uVar15;
          cVar26 = cVar3;
          lVar28 = lVar33;
          piVar34 = (int *)((long)piVar9 + lVar28);
          plVar5 = (long *)((long)plVar22 + lVar28);
          if ((piVar34 <= src) || (plVar5 <= local_40c8)) break;
          lVar33 = lVar28 + -1;
          cVar3 = cVar26 + -0x10;
          uVar15 = uVar4 - 1;
        } while (*(char *)((long)plVar22 + lVar28 + -1) == *(char *)((long)piVar9 + lVar28 + -1));
        iVar20 = (int)lVar28;
        uVar30 = (ulong)(uint)(iVar20 + (iVar19 - (int)local_40c8));
        plVar21 = (long *)((long)dst + 1);
        pcVar31 = (char *)((long)dst + ((ulong)uVar14 + lVar28 & 0xffffffff) / 0xff + uVar30 + 9);
        if (pcVar27 < pcVar31) {
          iVar12 = 1;
        }
        else {
          if ((uint)((ulong)uVar14 + lVar28) < 0xf) {
            *dst = cVar26;
            plVar22 = plVar21;
          }
          else {
            uVar6 = (ulong)(uVar14 - 0xf) + lVar28;
            *dst = -0x10;
            if (0xfe < (int)uVar6) {
              if (0x1fc < (int)uVar4) {
                uVar4 = 0x1fd;
              }
              uVar15 = (uVar14 - uVar4) + iVar20 + 0xef;
              uVar6 = (ulong)uVar15 / 0xff;
              memset(plVar21,0xff,(ulong)(uVar15 / 0xff + 1));
              plVar21 = (long *)((long)dst + uVar6 + 2);
              uVar6 = (ulong)((uVar14 - 0x10e) + iVar20 + (int)uVar6 * -0xff);
            }
            *(char *)plVar21 = (char)uVar6;
            plVar22 = (long *)((long)plVar21 + 1);
          }
          plVar21 = (long *)(uVar30 + (long)plVar22);
          plVar10 = local_40c8;
          do {
            *plVar22 = *plVar10;
            plVar22 = plVar22 + 1;
            plVar10 = plVar10 + 1;
          } while (plVar22 < plVar21);
          iVar12 = 0;
        }
        plVar22 = plVar5;
        piVar9 = piVar34;
        if (pcVar31 <= pcVar27) {
          do {
            *(short *)plVar21 = (short)plVar5 - (short)piVar34;
            puVar1 = (ulong *)((long)plVar5 + 4);
            puVar16 = (ulong *)(piVar34 + 1);
            puVar11 = puVar1;
            if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
              uVar6 = *(ulong *)((long)plVar5 + 4) ^ *(ulong *)(piVar34 + 1);
              uVar30 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = uVar30 >> 3 & 0x1fffffff;
              puVar11 = (ulong *)((long)plVar5 + 0xc);
              puVar16 = (ulong *)(piVar34 + 3);
              if (*(ulong *)(piVar34 + 1) == *(ulong *)((long)plVar5 + 4)) goto LAB_00110ca2;
            }
            else {
LAB_00110ca2:
              do {
                if (src + ((ulong)(uint)srcSize - 0xc) <= puVar11) {
                  if ((puVar11 < src + ((ulong)(uint)srcSize - 8)) &&
                     ((int)*puVar16 == (int)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 4);
                    puVar16 = (ulong *)((long)puVar16 + 4);
                  }
                  if ((puVar11 < src + ((ulong)(uint)srcSize - 6)) &&
                     ((short)*puVar16 == (short)*puVar11)) {
                    puVar11 = (ulong *)((long)puVar11 + 2);
                    puVar16 = (ulong *)((long)puVar16 + 2);
                  }
                  if (puVar11 < src + ((ulong)(uint)srcSize - 5)) {
                    puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar16 == (char)*puVar11));
                  }
                  uVar30 = (ulong)(uint)((int)puVar11 - (int)puVar1);
                  goto LAB_00110cdf;
                }
                uVar30 = *puVar16;
                uVar6 = *puVar11;
                uVar23 = uVar6 ^ uVar30;
                uVar24 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                iVar20 = (int)puVar11;
                puVar16 = puVar16 + 1;
                puVar11 = puVar11 + 1;
              } while (uVar30 == uVar6);
              uVar30 = (ulong)((((uint)(uVar24 >> 3) & 0x1fffffff) + iVar20) - (int)puVar1);
            }
LAB_00110cdf:
            plVar10 = (long *)((long)plVar21 + 2);
            uVar15 = (uint)uVar30;
            pcVar31 = (char *)((long)plVar21 + (ulong)(uVar15 + 0xf0) / 0xff + 8);
            if (pcVar31 <= pcVar27) {
              if (uVar15 < 0xf) {
                *dst = (char)*(long *)dst + (char)uVar30;
              }
              else {
                *dst = (char)*(long *)dst + '\x0f';
                uVar14 = uVar15 - 0xf;
                *(undefined4 *)plVar10 = 0xffffffff;
                if (0x3fb < uVar14) {
                  uVar15 = uVar15 - 0x40b;
                  memset((char *)((long)plVar21 + 6),0xff,(ulong)((uVar15 / 0x3fc) * 4 + 4));
                  uVar14 = uVar15 % 0x3fc;
                  plVar10 = (long *)((long)plVar21 + (ulong)((uVar15 / 0x3fc) * 4) + 6);
                }
                pcVar35 = (char *)((long)plVar10 + (ulong)uVar14 / 0xff);
                plVar10 = (long *)(pcVar35 + 1);
                *pcVar35 = (char)(uVar14 / 0xff) + (char)uVar14;
              }
            }
            lVar33 = uVar30 + (long)plVar5;
            plVar5 = (long *)(lVar33 + 4);
            plVar22 = plVar5;
            piVar9 = piVar34;
            plVar21 = plVar10;
            if (pcVar27 < pcVar31) {
              iVar12 = 1;
              goto LAB_00110ede;
            }
            local_40c8 = plVar5;
            if (src + ((ulong)(uint)srcSize - 0xb) <= plVar5) {
              iVar12 = 3;
              goto LAB_00110ede;
            }
            local_4050[(ulong)(*(long *)(lVar33 + 2) * -0x30e4432345000000) >> 0x34] =
                 ((int)lVar33 + 2) - iVar13;
            uVar30 = (ulong)(*plVar5 * -0x30e4432345000000) >> 0x34;
            uVar14 = (int)plVar5 - iVar13;
            uVar15 = local_4050[uVar30];
            piVar34 = (int *)((ulong)uVar15 + lVar29);
            local_4050[uVar30] = uVar14;
            bVar36 = true;
            if ((uVar14 <= uVar15 + 0xffff) && (*piVar34 == *(int *)plVar5)) {
              *(char *)plVar10 = '\0';
              bVar36 = false;
              plVar21 = (long *)((long)plVar10 + 1);
              dst = (char *)plVar10;
            }
          } while (!bVar36);
          uVar18 = (ulong)(*(long *)(lVar33 + 5) * -0x30e4432345000000) >> 0x34;
          iVar12 = 0;
          plVar22 = (long *)(lVar33 + 5);
          piVar9 = piVar34;
        }
      }
LAB_00110ede:
      dst = (char *)plVar21;
    } while (iVar12 == 0);
    if (iVar12 - 2U < 2) {
      pcVar35 = src + ((ulong)(uint)srcSize - (long)local_40c8);
      pcVar31 = (char *)((long)plVar21 + (long)(pcVar35 + (ulong)(pcVar35 + 0xf0) / 0xff + 1));
      if (pcVar31 <= pcVar27) {
        if (pcVar35 < (char *)0xf) {
          *(char *)plVar21 = (char)pcVar35 << 4;
        }
        else {
          pcVar8 = pcVar35 + -0xf;
          *(char *)plVar21 = -0x10;
          plVar22 = (long *)((long)plVar21 + 1);
          if ((char *)0xfe < pcVar8) {
            uVar18 = (ulong)(pcVar35 + -0x10e) / 0xff;
            memset(plVar22,0xff,uVar18 + 1);
            plVar22 = (long *)((long)plVar21 + uVar18 + 2);
            pcVar8 = pcVar35 + uVar18 * -0xff + -0x10e;
          }
          *(char *)plVar22 = (char)pcVar8;
          plVar21 = plVar22;
        }
        memcpy((char *)((long)plVar21 + 1),local_40c8,(size_t)pcVar35);
        plVar21 = (long *)((long)plVar21 + (long)(pcVar35 + 1));
      }
      if (pcVar27 < pcVar31) {
        return 0;
      }
      return (int)plVar21 - local_4090;
    }
LAB_00111577:
    iVar20 = 0;
  }
  return iVar20;
}

Assistant:

int LZ4_compress_fast_force(const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t ctx;
    LZ4_initStream(&ctx, sizeof(ctx));

    if (srcSize < LZ4_64Klimit) {
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, byU16,    noDict, noDictIssue, acceleration);
    } else {
        tableType_t const addrMode = (sizeof(void*) > 4) ? byU32 : byPtr;
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, addrMode, noDict, noDictIssue, acceleration);
    }
}